

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayUsageTests::init
          (SingleVertexArrayUsageTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  Usage usage_;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  GLValue GVar5;
  GLValue GVar6;
  Spec spec;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  string name;
  ArraySpec arraySpec;
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    type = (&DAT_005bd260)[lVar3];
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
        iVar1 = deqp::gls::Array::inputTypeSize(type);
        usage_ = *(Usage *)((long)&DAT_005a1f84 + lVar2);
        GVar5 = deqp::gls::GLValue::getMinValue(type);
        GVar6 = deqp::gls::GLValue::getMaxValue(type);
        max_._4_4_ = uStack_ac;
        max_.type = GVar6.type;
        min_._4_4_ = uStack_9c;
        min_.type = GVar5.type;
        min_.field_1 = GVar5.field_1;
        max_.field_1 = GVar6.field_1;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  (&arraySpec,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,usage_,2,0,0x11,false,min_,max_);
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        spec.primitive = PRIMITIVE_TRIANGLES;
        spec.drawCount = (&DAT_005bd478)[lVar4];
        spec.first = 0;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ::push_back(&spec.arrays,&arraySpec);
        deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&name,&spec);
        if ((int)(0x11 % (long)iVar1) != 0) {
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,&spec,
                     name._M_dataplus._M_p,name._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        }
        std::__cxx11::string::~string((string *)&name);
        std::
        _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ::~_Vector_base(&spec.arrays.
                         super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       );
      }
    }
  }
  return 4;
}

Assistant:

void SingleVertexArrayUsageTests::init (void)
{
	// Test usage
	Array::Usage		usages[]		= {Array::USAGE_STATIC_DRAW, Array::USAGE_STREAM_DRAW, Array::USAGE_DYNAMIC_DRAW};
	int					counts[]		= {1, 256};
	int					strides[]		= {17};
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
				{
					const int	componentCount	= 2;
					const int	stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * componentCount : strides[strideNdx]);
					const bool	aligned			= (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0;
					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	usages[usageNdx],
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();

					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}